

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

void player_spells_init(player *p)

{
  wchar_t wVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t len;
  
  wVar1 = (p->class->magic).total_spells;
  len = (size_t)wVar1;
  if (len != 0) {
    puVar2 = (uint8_t *)mem_zalloc(len);
    p->spell_flags = puVar2;
    puVar2 = (uint8_t *)mem_zalloc(len);
    p->spell_order = puVar2;
    uVar3 = 0;
    uVar4 = 0;
    if (L'\0' < wVar1) {
      uVar4 = (ulong)(uint)wVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      p->spell_order[uVar3] = 'c';
    }
  }
  return;
}

Assistant:

void player_spells_init(struct player *p)
{
	int i, num_spells = p->class->magic.total_spells;

	/* None */
	if (!num_spells) return;

	/* Allocate */
	p->spell_flags = mem_zalloc(num_spells * sizeof(uint8_t));
	p->spell_order = mem_zalloc(num_spells * sizeof(uint8_t));

	/* None of the spells have been learned yet */
	for (i = 0; i < num_spells; i++)
		p->spell_order[i] = 99;
}